

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

void __thiscall spvtools::opt::Function::Dump(Function *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Function #");
  result_id(this);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n");
  opt::operator<<(poVar1,this);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void Function::Dump() const {
  std::cerr << "Function #" << result_id() << "\n" << *this << "\n";
}